

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::ReadError::ReadError
          (ReadError *this,CStringRef filename,int line,int column,CStringRef format_str,
          ArgList args)

{
  std::runtime_error::runtime_error((runtime_error *)this,"");
  (this->super_Error).exit_code_ = 1;
  *(undefined ***)&(this->super_Error).super_RuntimeError = &PTR__ReadError_005d3148;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  init(this,(EVP_PKEY_CTX *)filename.data_);
  return;
}

Assistant:

ReadError(fmt::CStringRef filename, int line, int column,
            fmt::CStringRef format_str, fmt::ArgList args) {
    init(filename, line, column, format_str, args);
  }